

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

void pospopcnt_u8_avx2_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [32];
  ulong uVar2;
  int j;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined8 uVar27;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 in_ZMM16 [64];
  
  auVar7 = in_ZMM16._0_16_;
  if ((len & 0xffffffffffffff80) == 0) {
    auVar21 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    bVar5 = true;
    auVar22 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar26 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar25 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar24 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar41 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar43 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar46 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar23 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar20 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar18 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar17 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar15 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    pauVar1 = (undefined1 (*) [32])(data + (len & 0xffffffffffffff80));
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    iVar3 = 0;
    auVar32 = ZEXT1664((undefined1  [16])0x0);
    auVar8 = vpbroadcastq_avx512vl(ZEXT816(0x5555555555555555));
    auVar7 = auVar8._0_16_;
    auVar9 = vpbroadcastq_avx512vl(ZEXT816(0xaaaaaaaaaaaaaaaa));
    auVar10 = vpbroadcastq_avx512vl(ZEXT816(0x3333333333333333));
    auVar11 = vpbroadcastq_avx512vl(ZEXT816(0xcccccccccccccccc));
    auVar12 = vpbroadcastb_avx512vl(ZEXT116(0xf));
    auVar13 = vbroadcasti32x4_avx512vl(_DAT_0011f1c0);
    auVar35 = ZEXT1664((undefined1  [16])0x0);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    auVar30 = ZEXT1664((undefined1  [16])0x0);
    auVar31 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar45 = ZEXT1664((undefined1  [16])0x0);
    auVar44 = ZEXT1664((undefined1  [16])0x0);
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    auVar38 = ZEXT1664((undefined1  [16])0x0);
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar36 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar14 = vmovdqu64_avx512vl(*(undefined1 (*) [32])data);
      auVar15 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x20));
      auVar16 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x40));
      auVar17 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x60));
      auVar18 = vpaddb_avx512vl(auVar15,auVar15);
      auVar18 = vpternlogq_avx512vl(auVar18,auVar9,auVar14,0xe2);
      auVar15 = vpsrld_avx512vl(auVar15,1);
      auVar14 = vpternlogq_avx512vl(auVar15,auVar8,auVar14,0xe2);
      auVar15 = vpaddb_avx512vl(auVar17,auVar17);
      auVar15 = vpternlogq_avx512vl(auVar15,auVar9,auVar16,0xe2);
      auVar17 = vpsrld_avx512vl(auVar17,1);
      auVar16 = vpternlogq_avx512vl(auVar17,auVar8,auVar16,0xe2);
      auVar17 = vpslld_avx512vl(auVar15,2);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar11,auVar18,0xe2);
      auVar19 = vpslld_avx512vl(auVar16,2);
      auVar19 = vpternlogq_avx512vl(auVar19,auVar11,auVar14,0xe2);
      auVar15 = vpsrld_avx512vl(auVar15,2);
      auVar15 = vpternlogq_avx512vl(auVar15,auVar10,auVar18,0xe2);
      auVar16 = vpsrld_avx512vl(auVar16,2);
      auVar14 = vpternlogq_avx512vl(auVar16,auVar10,auVar14,0xe2);
      auVar16 = vpandq_avx512vl(auVar17,auVar12);
      auVar16 = vpshufb_avx512vl(auVar13,auVar16);
      auVar16 = vpaddb_avx512vl(auVar16,auVar40._0_32_);
      auVar40 = ZEXT3264(auVar16);
      auVar17 = vpsrld_avx512vl(auVar17,4);
      auVar17 = vpandq_avx512vl(auVar17,auVar12);
      auVar17 = vpshufb_avx512vl(auVar13,auVar17);
      auVar17 = vpaddb_avx512vl(auVar17,auVar39._0_32_);
      auVar39 = ZEXT3264(auVar17);
      auVar18 = vpandq_avx512vl(auVar19,auVar12);
      auVar18 = vpshufb_avx512vl(auVar13,auVar18);
      auVar18 = vpaddb_avx512vl(auVar18,auVar45._0_32_);
      auVar45 = ZEXT3264(auVar18);
      auVar19 = vpsrld_avx512vl(auVar19,4);
      auVar19 = vpandq_avx512vl(auVar19,auVar12);
      auVar19 = vpshufb_avx512vl(auVar13,auVar19);
      auVar19 = vpaddb_avx512vl(auVar19,auVar38._0_32_);
      auVar38 = ZEXT3264(auVar19);
      auVar20 = vpandq_avx512vl(auVar15,auVar12);
      auVar20 = vpshufb_avx512vl(auVar13,auVar20);
      auVar20 = vpaddb_avx512vl(auVar20,auVar44._0_32_);
      auVar44 = ZEXT3264(auVar20);
      auVar15 = vpsrld_avx512vl(auVar15,4);
      auVar15 = vpandq_avx512vl(auVar15,auVar12);
      auVar15 = vpshufb_avx512vl(auVar13,auVar15);
      auVar15 = vpaddb_avx512vl(auVar15,auVar37._0_32_);
      auVar37 = ZEXT3264(auVar15);
      auVar21 = vpandq_avx512vl(auVar14,auVar12);
      auVar21 = vpshufb_avx512vl(auVar13,auVar21);
      auVar21 = vpaddb_avx512vl(auVar21,auVar42._0_32_);
      auVar42 = ZEXT3264(auVar21);
      auVar14 = vpsrld_avx512vl(auVar14,4);
      auVar14 = vpandq_avx512vl(auVar14,auVar12);
      auVar14 = vpshufb_avx512vl(auVar13,auVar14);
      auVar22 = vpaddb_avx512vl(auVar14,auVar36._0_32_);
      auVar36 = ZEXT3264(auVar22);
      iVar3 = iVar3 + 1;
      if (iVar3 == 0x3f) {
        auVar6 = vpxord_avx512vl(auVar14._0_16_,auVar14._0_16_);
        auVar14 = vpsadbw_avx512vl(auVar16,ZEXT1632(auVar6));
        auVar14 = vpaddq_avx2(auVar14,auVar32._0_32_);
        auVar32 = ZEXT3264(auVar14);
        auVar14 = vpsadbw_avx512vl(auVar18,ZEXT1632(auVar6));
        auVar14 = vpaddq_avx2(auVar14,auVar35._0_32_);
        auVar35 = ZEXT3264(auVar14);
        auVar16 = ZEXT1632(auVar6);
        auVar14 = vpsadbw_avx512vl(auVar20,auVar16);
        auVar14 = vpaddq_avx2(auVar14,auVar34._0_32_);
        auVar34 = ZEXT3264(auVar14);
        auVar14 = vpsadbw_avx512vl(auVar21,auVar16);
        auVar14 = vpaddq_avx2(auVar14,auVar33._0_32_);
        auVar33 = ZEXT3264(auVar14);
        auVar14 = vpsadbw_avx512vl(auVar17,auVar16);
        auVar14 = vpaddq_avx2(auVar14,auVar30._0_32_);
        auVar30 = ZEXT3264(auVar14);
        auVar14 = vpsadbw_avx512vl(auVar19,auVar16);
        auVar14 = vpaddq_avx2(auVar14,auVar31._0_32_);
        auVar31 = ZEXT3264(auVar14);
        auVar14 = vpsadbw_avx512vl(auVar15,ZEXT1632(auVar6));
        auVar14 = vpaddq_avx2(auVar14,auVar29._0_32_);
        auVar29 = ZEXT3264(auVar14);
        auVar14 = vpsadbw_avx512vl(auVar22,ZEXT1632(auVar6));
        auVar14 = vpaddq_avx2(auVar14,auVar28._0_32_);
        auVar28 = ZEXT3264(auVar14);
        iVar3 = 0;
        auVar36 = ZEXT1664((undefined1  [16])0x0);
        auVar37 = ZEXT1664((undefined1  [16])0x0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar39 = ZEXT1664((undefined1  [16])0x0);
        auVar42 = ZEXT1664((undefined1  [16])0x0);
        auVar44 = ZEXT1664((undefined1  [16])0x0);
        auVar45 = ZEXT1664((undefined1  [16])0x0);
        auVar40 = ZEXT1664((undefined1  [16])0x0);
      }
      auVar17 = auVar33._0_32_;
      auVar26 = auVar37._0_32_;
      auVar20 = auVar29._0_32_;
      auVar19 = auVar31._0_32_;
      auVar18 = auVar30._0_32_;
      auVar21 = auVar28._0_32_;
      auVar16 = auVar34._0_32_;
      auVar15 = auVar35._0_32_;
      auVar14 = auVar32._0_32_;
      auVar22 = auVar36._0_32_;
      auVar25 = auVar38._0_32_;
      auVar24 = auVar39._0_32_;
      auVar41 = auVar42._0_32_;
      auVar43 = auVar44._0_32_;
      auVar46 = auVar45._0_32_;
      auVar23 = auVar40._0_32_;
      data = (uint8_t *)((long)data + 0x80);
    } while ((undefined1 (*) [32])data != pauVar1);
    bVar5 = iVar3 == 0;
  }
  if (!bVar5) {
    auVar7 = vpxord_avx512vl(auVar7,auVar7);
    auVar23 = vpsadbw_avx512vl(auVar23,ZEXT1632(auVar7));
    auVar14 = vpaddq_avx2(auVar23,auVar14);
    auVar23 = vpsadbw_avx512vl(auVar46,ZEXT1632(auVar7));
    auVar15 = vpaddq_avx2(auVar23,auVar15);
    auVar46 = ZEXT1632(auVar7);
    auVar23 = vpsadbw_avx512vl(auVar43,auVar46);
    auVar16 = vpaddq_avx2(auVar23,auVar16);
    auVar23 = vpsadbw_avx512vl(auVar41,auVar46);
    auVar17 = vpaddq_avx2(auVar23,auVar17);
    auVar24 = vpsadbw_avx512vl(auVar24,auVar46);
    auVar18 = vpaddq_avx2(auVar24,auVar18);
    auVar25 = vpsadbw_avx512vl(auVar25,auVar46);
    auVar19 = vpaddq_avx2(auVar25,auVar19);
    auVar26 = vpsadbw_avx512vl(auVar26,ZEXT1632(auVar7));
    auVar20 = vpaddq_avx2(auVar26,auVar20);
    auVar22 = vpsadbw_avx512vl(auVar22,ZEXT1632(auVar7));
    auVar21 = vpaddq_avx2(auVar22,auVar21);
  }
  auVar7 = vpunpcklqdq_avx(auVar14._0_16_,auVar15._0_16_);
  auVar22._0_16_ = ZEXT116(0) * auVar16._0_16_ + ZEXT116(1) * auVar7;
  auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar16._0_16_;
  uVar27 = auVar17._0_8_;
  auVar26._8_8_ = uVar27;
  auVar26._0_8_ = uVar27;
  auVar26._16_8_ = uVar27;
  auVar26._24_8_ = uVar27;
  auVar22 = vpblendd_avx2(auVar22,auVar26,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar14._0_16_,auVar15._0_16_);
  auVar26 = vpermq_avx2(auVar16,0x55);
  auVar26 = vpblendd_avx2(ZEXT1632(auVar7),auVar26,0xf0);
  auVar6 = auVar21._0_16_;
  auVar25._0_16_ = ZEXT116(0) * auVar17._0_16_ + ZEXT116(1) * auVar6;
  auVar25._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar17._0_16_;
  auVar26 = vpblendd_avx2(auVar26,auVar25,0xc0);
  auVar22 = vpaddq_avx2(auVar22,auVar26);
  auVar26 = vpunpcklqdq_avx2(auVar14,auVar15);
  auVar25 = vperm2i128_avx2(auVar26,auVar16,0x31);
  auVar26 = vpmovsxbq_avx2(ZEXT416(0x6020100));
  auVar25 = vpermt2q_avx512vl(auVar25,auVar26,auVar17);
  auVar22 = vpaddq_avx2(auVar22,auVar25);
  auVar14 = vpunpckhqdq_avx2(auVar14,auVar15);
  auVar15 = vpmovsxbq_avx2(ZEXT416(0x7070302));
  auVar14 = vpermt2q_avx512vl(auVar14,auVar15,auVar16);
  auVar14 = vpblendd_avx2(auVar14,auVar17,0xc0);
  auVar14 = vpaddq_avx2(auVar22,auVar14);
  auVar7 = vpmovqd_avx512vl(auVar14);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar7;
  auVar7 = vpunpcklqdq_avx(auVar18._0_16_,auVar19._0_16_);
  auVar14._0_16_ = ZEXT116(0) * auVar20._0_16_ + ZEXT116(1) * auVar7;
  auVar14._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar20._0_16_;
  uVar27 = auVar21._0_8_;
  auVar16._8_8_ = uVar27;
  auVar16._0_8_ = uVar27;
  auVar16._16_8_ = uVar27;
  auVar16._24_8_ = uVar27;
  auVar14 = vpblendd_avx2(auVar14,auVar16,0xc0);
  auVar7 = vpunpckhqdq_avx(auVar18._0_16_,auVar19._0_16_);
  auVar16 = vpermq_avx2(auVar20,0x55);
  auVar16 = vpblendd_avx2(ZEXT1632(auVar7),auVar16,0xf0);
  auVar17._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar6;
  auVar17._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar6;
  auVar16 = vpblendd_avx2(auVar16,auVar17,0xc0);
  auVar14 = vpaddq_avx2(auVar14,auVar16);
  auVar16 = vpunpcklqdq_avx2(auVar18,auVar19);
  auVar16 = vperm2i128_avx2(auVar16,auVar20,0x31);
  auVar16 = vpermt2q_avx512vl(auVar16,auVar26,auVar21);
  auVar14 = vpaddq_avx2(auVar14,auVar16);
  auVar16 = vpunpckhqdq_avx2(auVar18,auVar19);
  auVar15 = vpermt2q_avx512vl(auVar16,auVar15,auVar20);
  auVar15 = vpblendd_avx2(auVar15,auVar21,0xc0);
  auVar14 = vpaddq_avx2(auVar14,auVar15);
  auVar7 = vpmovqd_avx512vl(auVar14);
  auVar7 = vpaddd_avx(auVar7,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar7;
  if ((len & 0x7f) != 0) {
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        flag_counts[lVar4] =
             flag_counts[lVar4] +
             (uint)(((byte)(*(undefined1 (*) [32])data)[uVar2] >> ((uint)lVar4 & 0x1f) & 1) != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0x7f));
  }
  return;
}

Assistant:

void pospopcnt_u8_avx2_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    const __m256i popcnt_4bit = _mm256_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4,

        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m256i lo_nibble = _mm256_set1_epi8(0x0f);

    int local = 0;
    __m256i counter8bit_a = zero;
    __m256i counter8bit_b = zero;
    __m256i counter8bit_c = zero;
    __m256i counter8bit_d = zero;
    __m256i counter8bit_e = zero;
    __m256i counter8bit_f = zero;
    __m256i counter8bit_g = zero;
    __m256i counter8bit_h = zero;

    for (const uint8_t* end = &data[len & ~(4*32 - 1)]; data != end; data += 4*32) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m256i s0 = avx2_merge1_even(r0, r1);
        const __m256i s1 = avx2_merge1_odd (r0, r1);
        const __m256i s2 = avx2_merge1_even(r2, r3);
        const __m256i s3 = avx2_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m256i d0 = avx2_merge2_even(s0, s2);
        const __m256i d1 = avx2_merge2_even(s1, s3);
        const __m256i d2 = avx2_merge2_odd (s0, s2);
        const __m256i d3 = avx2_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i popcnt_a = _mm256_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m256i popcnt_e = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d0, 4) & lo_nibble);
        const __m256i popcnt_b = _mm256_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m256i popcnt_f = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d1, 4) & lo_nibble);
        const __m256i popcnt_c = _mm256_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m256i popcnt_g = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d2, 4) & lo_nibble);
        const __m256i popcnt_d = _mm256_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m256i popcnt_h = _mm256_shuffle_epi8(popcnt_4bit, _mm256_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm256_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm256_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm256_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm256_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm256_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm256_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm256_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm256_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm256_setzero_si256();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm256_add_epi64(counter_##n, _mm256_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_b);
    flag_counts[2] += avx2_sum_epu64(counter_c);
    flag_counts[3] += avx2_sum_epu64(counter_d);
    flag_counts[4] += avx2_sum_epu64(counter_e);
    flag_counts[5] += avx2_sum_epu64(counter_f);
    flag_counts[6] += avx2_sum_epu64(counter_g);
    flag_counts[7] += avx2_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % (4*32), flag_counts);
}